

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool parse_args(char ***argv,path *input,path *output,DataInfo *data,ConfigInfo *conf,
               Options *options)

{
  Options *pOVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  path *__lhs;
  ulong uVar5;
  long lVar6;
  uint32_t *puVar7;
  value_type *local_778;
  invalid_opt *e;
  char *local_6e0;
  char *name_4;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  char *local_688;
  char *name_3;
  int local_678;
  uint local_674 [2];
  optional<unsigned_int> local_66c;
  uint local_664 [2];
  optional<unsigned_int> local_65c;
  int local_654;
  uint local_650 [2];
  optional<unsigned_int> local_648;
  char *local_640;
  char *ver;
  char *name_2;
  char *name_1;
  char *path_1;
  char *path;
  pointer local_610;
  char **argv2;
  char *local_600;
  value_type *end;
  value_type *it;
  small_vector<char_*,_128> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cmdline;
  path local_190;
  path local_150;
  path local_110;
  undefined1 local_d0 [8];
  optional<std::string> opt_cmdline;
  string_view local_98;
  iequal_to local_81;
  char *local_80;
  char *name;
  char *local_68;
  char *info;
  char *o;
  uint local_48;
  bool local_41;
  int32_t temp_i32;
  bool flag;
  Options *options_local;
  ConfigInfo *conf_local;
  DataInfo *data_local;
  path *output_local;
  path *input_local;
  char ***argv_local;
  
  _temp_i32 = options;
  options_local = (Options *)conf;
  conf_local = (ConfigInfo *)data;
  data_local = (DataInfo *)output;
  output_local = input;
  input_local = (path *)argv;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                if (**(long **)&input_local->_M_pathname == 0) {
                  argv_local._7_1_ = 1;
                  goto LAB_002f854b;
                }
                if (*(char *)**(undefined8 **)&input_local->_M_pathname == '-') break;
                bVar2 = std::experimental::filesystem::v1::__cxx11::path::empty(output_local);
                if (!bVar2) {
                  fprintf(_stderr,"gta3sc: error: input file appears twice\n");
                  argv_local._7_1_ = 0;
                  goto LAB_002f854b;
                }
                std::experimental::filesystem::v1::__cxx11::path::operator=
                          (output_local,*(char ***)&input_local->_M_pathname);
                *(long *)&input_local->_M_pathname = *(long *)&input_local->_M_pathname + 8;
              }
              pcVar4 = optget((char ***)input_local,"-h","--help",0);
              if (pcVar4 != (char *)0x0) {
                _temp_i32->help = true;
                argv_local._7_1_ = 1;
                goto LAB_002f854b;
              }
              pcVar4 = optget((char ***)input_local,(char *)0x0,"--version",0);
              if (pcVar4 != (char *)0x0) {
                _temp_i32->version = true;
                argv_local._7_1_ = 1;
                goto LAB_002f854b;
              }
              info = optget((char ***)input_local,"-o",(char *)0x0,1);
              if (info == (char *)0x0) break;
              std::experimental::filesystem::v1::__cxx11::path::operator=
                        (&data_local->datadir,&info);
            }
            pcVar4 = optget((char ***)input_local,(char *)0x0,"-pedantic-errors",0);
            if (pcVar4 == (char *)0x0) break;
            _temp_i32->pedantic = true;
            _temp_i32->pedantic_errors = true;
          }
          pcVar4 = optget((char ***)input_local,(char *)0x0,"-pedantic",0);
          if (pcVar4 == (char *)0x0) break;
          _temp_i32->pedantic = true;
        }
        pcVar4 = optget((char ***)input_local,(char *)0x0,"--guesser",0);
        if (pcVar4 == (char *)0x0) break;
        _temp_i32->guesser = true;
      }
      local_68 = optget((char ***)input_local,(char *)0x0,"--expect-var",1);
      pOVar1 = _temp_i32;
      if (local_68 != (char *)0x0) break;
      pcVar4 = optget((char ***)input_local,(char *)0x0,"--recursive-traversal",0);
      if (pcVar4 == (char *)0x0) {
        local_80 = optget((char ***)input_local,(char *)0x0,"--config",1);
        if (local_80 == (char *)0x0) {
          path_1 = optget((char ***)input_local,(char *)0x0,"--add-config",1);
          if (path_1 == (char *)0x0) {
            name_1 = optget((char ***)input_local,(char *)0x0,"--datadir",1);
            if (name_1 == (char *)0x0) {
              name_2 = optget((char ***)input_local,(char *)0x0,"--levelfile",1);
              if (name_2 == (char *)0x0) {
                ver = optget((char ***)input_local,(char *)0x0,"--error-format",1);
                if (ver == (char *)0x0) {
                  local_640 = optget((char ***)input_local,(char *)0x0,"-mheader",1);
                  if (local_640 == (char *)0x0) {
                    pcVar4 = optflag((char ***)input_local,"-mno-header",(bool *)0x0);
                    if (pcVar4 == (char *)0x0) {
                      pcVar4 = optflag((char ***)input_local,"-moatc",&local_41);
                      if (pcVar4 == (char *)0x0) {
                        pcVar4 = optflag((char ***)input_local,"-mq11.4",&local_41);
                        if (pcVar4 == (char *)0x0) {
                          pcVar4 = optflag((char ***)input_local,"-mtyped-text-label",&local_41);
                          if (pcVar4 == (char *)0x0) {
                            pcVar4 = optflag((char ***)input_local,"-moptimize-andor",&local_41);
                            if (pcVar4 == (char *)0x0) {
                              pcVar4 = optflag((char ***)input_local,"-moptimize-zero",&local_41);
                              if (pcVar4 == (char *)0x0) {
                                pcVar4 = optget((char ***)input_local,(char *)0x0,"-O",0);
                                if (pcVar4 == (char *)0x0) {
                                  pcVar4 = optflag((char ***)input_local,"-fentity-tracking",
                                                   &local_41);
                                  if (pcVar4 == (char *)0x0) {
                                    pcVar4 = optflag((char ***)input_local,"-fscript-name-check",
                                                     &local_41);
                                    if (pcVar4 == (char *)0x0) {
                                      pcVar4 = optflag((char ***)input_local,"-frelax-not",&local_41
                                                      );
                                      if (pcVar4 == (char *)0x0) {
                                        pcVar4 = optflag((char ***)input_local,"-fswitch",&local_41)
                                        ;
                                        if (pcVar4 == (char *)0x0) {
                                          pcVar4 = optflag((char ***)input_local,"-fbreak-continue",
                                                           (bool *)0x0);
                                          if (pcVar4 == (char *)0x0) {
                                            pcVar4 = optflag((char ***)input_local,
                                                             "-fscope-then-label",&local_41);
                                            if (pcVar4 == (char *)0x0) {
                                              pcVar4 = optflag((char ***)input_local,
                                                               "-funderscore-idents",&local_41);
                                              if (pcVar4 == (char *)0x0) {
                                                pcVar4 = optflag((char ***)input_local,"-farrays",
                                                                 &local_41);
                                                if (pcVar4 == (char *)0x0) {
                                                  pcVar4 = optflag((char ***)input_local,"-fconst",
                                                                   &local_41);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optflag((char ***)input_local,
                                                                     "-fstreamed-scripts",&local_41)
                                                    ;
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag((char ***)input_local,
                                                                       "-ftext-label-vars",&local_41
                                                                      );
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optflag((char ***)input_local,
                                                                         "-fskip-cutscene",&local_41
                                                                        );
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optflag((char ***)input_local,
                                                                           "-mlocal-offsets",
                                                                           (bool *)0x0);
                                                          if (pcVar4 == (char *)0x0) {
                                                            pcVar4 = optint<int>((char ***)
                                                                                 input_local,
                                                                                 "-ftimer-index",
                                                                                 &_temp_i32->
                                                                                  timer_index,10);
                                                            if ((pcVar4 == (char *)0x0) &&
                                                               (pcVar4 = optint<unsigned_int>
                                                                                   ((char ***)
                                                                                    input_local,
                                                                                                                                                                        
                                                  "-flocal-var-limit",&_temp_i32->local_var_limit,10
                                                  ), pcVar4 == (char *)0x0)) {
                                                    pcVar4 = optint<int>((char ***)input_local,
                                                                         "-fmission-var-limit",
                                                                         (int *)&local_48,10);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optint<int>((char ***)input_local,
                                                                           "-fmission-var-begin",
                                                                           (int *)&local_48,10);
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optint<int>((char ***)input_local,
                                                                             "-fswitch-case-limit",
                                                                             (int *)&local_48,10);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optint<int>((char ***)input_local
                                                                               ,"-farray-elem-limit"
                                                                               ,(int *)&local_48,10)
                                                          ;
                                                          if (pcVar4 == (char *)0x0) {
                                                            pcVar4 = optflag((char ***)input_local,
                                                                             "-fsyntax-only",
                                                                             (bool *)0x0);
                                                            if (pcVar4 == (char *)0x0) {
                                                              pcVar4 = optflag((char ***)input_local
                                                                               ,"-emit-ir2",
                                                                               (bool *)0x0);
                                                              if (pcVar4 == (char *)0x0) {
                                                                pcVar4 = optflag((char ***)
                                                                                 input_local,
                                                                                 "-fcleo",(bool *)
                                                  0x0);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optget((char ***)input_local,
                                                                    (char *)0x0,"--cs",0);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optget((char ***)input_local,
                                                                      (char *)0x0,"--cm",0);
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optflag((char ***)input_local,
                                                                         "-fmission-script",
                                                                         (bool *)0x0);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optflag((char ***)input_local,
                                                                           "-Werror",&local_41);
                                                          if (pcVar4 == (char *)0x0) {
                                                            pcVar4 = optflag((char ***)input_local,
                                                                                                                                                          
                                                  "-Wconflict-text-label-var",&local_41);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optflag((char ***)input_local,
                                                                     "-Wexpect-var",&local_41);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag((char ***)input_local,
                                                                       "-fconstant-checks",&local_41
                                                                      );
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optget((char ***)input_local,"-D",
                                                                        "--define",1);
                                                        pOVar1 = _temp_i32;
                                                        local_688 = pcVar4;
                                                        if (pcVar4 == (char *)0x0) {
                                                          local_6e0 = optget((char ***)input_local,
                                                                             "-U","--undefine",1);
                                                          pOVar1 = _temp_i32;
                                                          if (local_6e0 == (char *)0x0) {
                                                            fprintf(_stderr,
                                                  "gta3sc: error: unregonized argument \'%s\'\n",
                                                  **(undefined8 **)&input_local->_M_pathname);
                                                  argv_local._7_1_ = 0;
                                                  goto LAB_002f854b;
                                                  }
                                                  libcxx_strviewclone::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&e,local_6e0);
                                                  Options::undefine(pOVar1,(string_view *)&e);
                                                  }
                                                  else {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_6a8,pcVar4,
                                                               &local_6a9);
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_6d0,"1",
                                                               (allocator<char> *)
                                                               ((long)&name_4 + 7));
                                                    Options::define(pOVar1,&local_6a8,&local_6d0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_6d0);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               ((long)&name_4 + 7));
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_6a8);
                                                    std::allocator<char>::~allocator(&local_6a9);
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->constant_checks =
                                                         (bool)(local_41 & 1);
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->warn_expect_var =
                                                         (bool)(local_41 & 1);
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->warn_conflict_text_label_var =
                                                         (bool)(local_41 & 1);
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->warning_is_error =
                                                         (bool)(local_41 & 1);
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->mission_script = true;
                                                  }
                                                  }
                                                  else {
                                                    name_3._0_4_ = 0;
                                                    std::experimental::optional<unsigned_char>::
                                                    emplace<int>(&_temp_i32->cleo,(int *)&name_3);
                                                    _temp_i32->output_cleo = true;
                                                    _temp_i32->mission_script = true;
                                                    _temp_i32->headerless = true;
                                                    _temp_i32->use_local_offsets = true;
                                                  }
                                                  }
                                                  else {
                                                    name_3._4_4_ = 0;
                                                    std::experimental::optional<unsigned_char>::
                                                    emplace<int>(&_temp_i32->cleo,
                                                                 (int *)((long)&name_3 + 4));
                                                    _temp_i32->output_cleo = true;
                                                    _temp_i32->mission_script = false;
                                                    _temp_i32->headerless = true;
                                                    _temp_i32->use_local_offsets = true;
                                                  }
                                                  }
                                                  else {
                                                    local_678 = 0;
                                                    std::experimental::optional<unsigned_char>::
                                                    emplace<int>(&_temp_i32->cleo,&local_678);
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->emit_ir2 = true;
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->fsyntax_only = true;
                                                  }
                                                  }
                                                  else {
                                                    if ((int)local_48 < 0) {
                                                      std::experimental::optional<unsigned_int>::
                                                      optional(&local_66c);
                                                    }
                                                    else {
                                                      local_674[0] = local_48;
                                                      std::experimental::optional<unsigned_int>::
                                                      optional(&local_66c,local_674);
                                                    }
                                                    std::experimental::optional<unsigned_int>::
                                                    operator=(&_temp_i32->array_elem_limit,
                                                              &local_66c);
                                                  }
                                                  }
                                                  else {
                                                    if ((int)local_48 < 0) {
                                                      std::experimental::optional<unsigned_int>::
                                                      optional(&local_65c);
                                                    }
                                                    else {
                                                      local_664[0] = local_48;
                                                      std::experimental::optional<unsigned_int>::
                                                      optional(&local_65c,local_664);
                                                    }
                                                    std::experimental::optional<unsigned_int>::
                                                    operator=(&_temp_i32->switch_case_limit,
                                                              &local_65c);
                                                  }
                                                  }
                                                  else {
                                                    local_654 = 0;
                                                    puVar7 = (uint32_t *)
                                                             std::max<int>(&local_654,
                                                                           (int *)&local_48);
                                                    _temp_i32->mission_var_begin = *puVar7;
                                                  }
                                                  }
                                                  else {
                                                    if ((int)local_48 < 0) {
                                                      std::experimental::optional<unsigned_int>::
                                                      optional(&local_648);
                                                    }
                                                    else {
                                                      local_650[0] = local_48;
                                                      std::experimental::optional<unsigned_int>::
                                                      optional(&local_648,local_650);
                                                    }
                                                    std::experimental::optional<unsigned_int>::
                                                    operator=(&_temp_i32->mission_var_limit,
                                                              &local_648);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->use_local_offsets = true;
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->skip_cutscene = (bool)(local_41 & 1);
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->text_label_vars =
                                                         (bool)(local_41 & 1);
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->streamed_scripts =
                                                         (bool)(local_41 & 1);
                                                  }
                                                  }
                                                  else {
                                                    _temp_i32->fconst = (bool)(local_41 & 1);
                                                  }
                                                }
                                                else {
                                                  _temp_i32->farrays = (bool)(local_41 & 1);
                                                }
                                              }
                                              else {
                                                _temp_i32->allow_underscore_identifiers =
                                                     (bool)(local_41 & 1);
                                              }
                                            }
                                            else {
                                              _temp_i32->scope_then_label = (bool)(local_41 & 1);
                                            }
                                          }
                                          else {
                                            _temp_i32->allow_break_continue = true;
                                          }
                                        }
                                        else {
                                          _temp_i32->fswitch = (bool)(local_41 & 1);
                                        }
                                      }
                                      else {
                                        _temp_i32->relax_not = (bool)(local_41 & 1);
                                      }
                                    }
                                    else {
                                      _temp_i32->script_name_check = (bool)(local_41 & 1);
                                    }
                                  }
                                  else {
                                    _temp_i32->entity_tracking = (bool)(local_41 & 1);
                                  }
                                }
                                else {
                                  _temp_i32->optimize_andor = true;
                                  _temp_i32->optimize_zero_floats = true;
                                }
                              }
                              else {
                                _temp_i32->optimize_zero_floats = (bool)(local_41 & 1);
                              }
                            }
                            else {
                              _temp_i32->optimize_andor = (bool)(local_41 & 1);
                            }
                          }
                          else {
                            _temp_i32->has_text_label_prefix = (bool)(local_41 & 1);
                          }
                        }
                        else {
                          _temp_i32->use_half_float = (bool)(local_41 & 1);
                        }
                      }
                      else {
                        _temp_i32->oatc = (bool)(local_41 & 1);
                      }
                    }
                    else {
                      _temp_i32->headerless = true;
                    }
                  }
                  else {
                    iVar3 = strcmp(local_640,"gta3");
                    if (iVar3 == 0) {
                      _temp_i32->header = GTA3;
                    }
                    else {
                      iVar3 = strcmp(local_640,"gtavc");
                      if (iVar3 == 0) {
                        _temp_i32->header = GTAVC;
                      }
                      else {
                        iVar3 = strcmp(local_640,"gtasa");
                        if (iVar3 != 0) {
                          fprintf(_stderr,
                                  "gta3sc: error: invalid header version, must be \'gta3\', \'gtavc\' or \'gtasa\'\n"
                                 );
                          argv_local._7_1_ = 0;
                          goto LAB_002f854b;
                        }
                        _temp_i32->header = GTASA;
                      }
                    }
                  }
                }
                else {
                  iVar3 = strcmp(ver,"default");
                  if (iVar3 == 0) {
                    _temp_i32->error_format = Default;
                  }
                  else {
                    iVar3 = strcmp(ver,"json");
                    if (iVar3 != 0) {
                      fprintf(_stderr,"gta3sc: error: invalid error-format\n");
                      argv_local._7_1_ = 0;
                      goto LAB_002f854b;
                    }
                    _temp_i32->error_format = JSON;
                  }
                }
              }
              else {
                std::__cxx11::string::operator=
                          ((string *)&conf_local[1].config_name._M_string_length,name_2);
              }
            }
            else {
              std::experimental::filesystem::v1::__cxx11::path::operator=
                        ((path *)conf_local,&name_1);
            }
          }
          else {
            std::
            vector<std::experimental::filesystem::v1::__cxx11::path,std::allocator<std::experimental::filesystem::v1::__cxx11::path>>
            ::emplace_back<char_const*&>
                      ((vector<std::experimental::filesystem::v1::__cxx11::path,std::allocator<std::experimental::filesystem::v1::__cxx11::path>>
                        *)&options_local->warn_expect_var,&path_1);
          }
        }
        else {
          libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>::
          basic_string_view<std::allocator<char>>
                    ((basic_string_view<char,std::char_traits<char>> *)&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     options_local);
          libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&opt_cmdline.super_OptionalBase<std::__cxx11::basic_string<char>_>.
                             storage_.value_.field_2 + 8),local_80);
          bVar2 = iequal_to::operator()
                            (&local_81,&local_98,
                             (string_view *)
                             ((long)&opt_cmdline.
                                     super_OptionalBase<std::__cxx11::basic_string<char>_>.storage_.
                                     value_.field_2 + 8));
          if (!bVar2) {
            std::__cxx11::string::operator=((string *)options_local,local_80);
            __lhs = config_path_abi_cxx11_();
            std::experimental::filesystem::v1::__cxx11::path::
            path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                      (&local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       options_local);
            std::experimental::filesystem::v1::__cxx11::operator/(&local_150,__lhs,&local_190);
            std::experimental::filesystem::v1::__cxx11::path::
            path<char[16],std::experimental::filesystem::v1::__cxx11::path>
                      ((path *)&cmdline,(char (*) [16])"commandline.txt");
            std::experimental::filesystem::v1::__cxx11::operator/
                      (&local_110,&local_150,(path *)&cmdline);
            read_file_utf8((optional<std::string> *)local_d0,&local_110);
            std::experimental::filesystem::v1::__cxx11::path::~path(&local_110);
            std::experimental::filesystem::v1::__cxx11::path::~path((path *)&cmdline);
            std::experimental::filesystem::v1::__cxx11::path::~path(&local_150);
            std::experimental::filesystem::v1::__cxx11::path::~path(&local_190);
            bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)local_d0);
            if (bVar2) {
              args.Storage.InlineElts[0x7e] =
                   (U)std::experimental::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_d0);
              llvm_vecsmall::SmallVector<char_*,_128U>::SmallVector
                        ((SmallVector<char_*,_128U> *)&it);
              uVar5 = std::__cxx11::string::empty();
              if ((uVar5 & 1) == 0) {
                local_778 = (value_type *)
                            std::__cxx11::string::operator[]((ulong)args.Storage.InlineElts[0x7e]);
              }
              else {
                local_778 = (value_type *)0x0;
              }
              end = local_778;
              lVar6 = std::__cxx11::string::size();
              local_600 = local_778 + lVar6;
              while (end != local_600) {
                end = std::find_if_not<char*,int(*)(int)noexcept>(end,local_600,isspace);
                llvm_vecsmall::SmallVectorImpl<char*>::emplace_back<char*&>
                          ((SmallVectorImpl<char*> *)&it,&end);
                pcVar4 = std::find_if<char*,int(*)(int)noexcept>(end,local_600,isspace);
                end = pcVar4;
                if (pcVar4 != local_600) {
                  end = pcVar4 + 1;
                  *pcVar4 = '\0';
                }
              }
              argv2 = (char **)0x0;
              llvm_vecsmall::SmallVectorImpl<char*>::emplace_back<decltype(nullptr)>
                        ((SmallVectorImpl<char*> *)&it,&argv2);
              local_610 = llvm_vecsmall::SmallVectorTemplateCommon<char_*,_void>::data
                                    ((SmallVectorTemplateCommon<char_*,_void> *)&it);
              bVar2 = parse_args(&local_610,output_local,&data_local->datadir,(DataInfo *)conf_local
                                 ,(ConfigInfo *)options_local,_temp_i32);
              if (!bVar2) {
                argv_local._7_1_ = 0;
              }
              path._4_4_ = (uint)!bVar2;
              llvm_vecsmall::SmallVector<char_*,_128U>::~SmallVector
                        ((SmallVector<char_*,_128U> *)&it);
              if (path._4_4_ == 0) {
                path._4_4_ = 0;
              }
            }
            else {
              fprintf(_stderr,"gta3sc: error: config path is missing commandline.txt file\n");
              argv_local._7_1_ = 0;
              path._4_4_ = 1;
            }
            std::experimental::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_d0);
            if (path._4_4_ != 0) goto LAB_002f854b;
          }
        }
      }
      else {
        _temp_i32->linear_sweep = false;
      }
    }
    libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&name,local_68);
    bVar2 = Options::push_expect_var(pOVar1,(string_view *)&name);
  } while (((bVar2 ^ 0xffU) & 1) == 0);
  fprintf(_stderr,"gta3sc: error: failed to parse --expect-var entry\n");
  argv_local._7_1_ = 0;
LAB_002f854b:
  return (bool)(argv_local._7_1_ & 1);
}

Assistant:

bool parse_args(char**& argv, fs::path& input, fs::path& output, DataInfo& data, ConfigInfo& conf, Options& options)
{
    try
    {
        bool flag;
        int32_t temp_i32;

        while(*argv)
        {
            if(**argv != '-')
            {
                if(!input.empty())
                {
                    fprintf(stderr, "gta3sc: error: input file appears twice\n");
                    return false;
                }

                input = *argv;
                ++argv;
            }
            else if(optget(argv, "-h", "--help", 0))
            {
                options.help = true;
                return true;
            }
            else if(optget(argv, nullptr, "--version", 0))
            {
                options.version = true;
                return true;
            }
            else if(const char* o = optget(argv, "-o", nullptr, 1))
            {
                output = o;
            }
            else if(optget(argv, nullptr, "-pedantic-errors", 0))
            {
                options.pedantic = true;
                options.pedantic_errors = true;
            }
            else if(optget(argv, nullptr, "-pedantic", 0))
            {
                options.pedantic = true;
            }
            else if(optget(argv, nullptr, "--guesser", 0))
            {
                options.guesser = true;
            }
            else if(const char* info = optget(argv, nullptr, "--expect-var", 1))
            {
                if(!options.push_expect_var(info))
                {
                    fprintf(stderr, "gta3sc: error: failed to parse --expect-var entry\n");
                    return false;
                }
            }
            else if(optget(argv, nullptr, "--recursive-traversal", 0))
            {
                options.linear_sweep = false;
            }
            else if(const char* name = optget(argv, nullptr, "--config", 1))
            {
                // avoid infinite recursion of parse_args(...) calls
                if(iequal_to()(conf.config_name, name))
                    continue;

                conf.config_name = name;

                if(auto opt_cmdline = read_file_utf8(config_path() / conf.config_name / "commandline.txt"))
                {
                    auto& cmdline = *opt_cmdline;
                    small_vector<char*, 128> args;

                    auto it = !cmdline.empty()? &cmdline[0] : nullptr;
                    auto end = it + cmdline.size();
                    for(; it != end; )
                    {
                        it = std::find_if_not(it, end, ::isspace);
                        args.emplace_back(it);
                        it = std::find_if(it, end, ::isspace);
                        if(it != end) *it++ = '\0';
                    }
                    args.emplace_back(nullptr);

                    char** argv2 = args.data();
                    if(!parse_args(argv2, input, output, data, conf, options))
                        return false;
                }
                else
                {
                    fprintf(stderr, "gta3sc: error: config path is missing commandline.txt file\n");
                    return false;
                }
            }
            else if(const char* path = optget(argv, nullptr, "--add-config", 1))
            {
                conf.add_config_files.emplace_back(path);
            }
            else if(const char* path = optget(argv, nullptr, "--datadir", 1))
            {
                data.datadir = path;
            }
            else if(const char* name = optget(argv, nullptr, "--levelfile", 1))
            {
                data.levelfile = name;
            }
            else if(const char* name = optget(argv, nullptr, "--error-format", 1))
            {
                if(!strcmp(name, "default"))
                    options.error_format = Options::ErrorFormat::Default;
                else if(!strcmp(name, "json"))
                    options.error_format = Options::ErrorFormat::JSON;
                else
                {
                    fprintf(stderr, "gta3sc: error: invalid error-format\n");
                    return false;
                }
            }
            else if(const char* ver = optget(argv, nullptr, "-mheader", 1))
            {
                if(!strcmp(ver, "gta3"))
                    options.header = Options::HeaderVersion::GTA3;
                else if(!strcmp(ver, "gtavc"))
                    options.header = Options::HeaderVersion::GTAVC;
                else if(!strcmp(ver, "gtasa"))
                    options.header = Options::HeaderVersion::GTASA;
                else
                {
                    fprintf(stderr, "gta3sc: error: invalid header version, must be 'gta3', 'gtavc' or 'gtasa'\n");
                    return false;
                }
            }
            else if(optflag(argv, "-mno-header", nullptr))
            {
                options.headerless = true;
            }
            else if(optflag(argv, "-moatc", &flag))
            {
                options.oatc = flag;
            }
            else if(optflag(argv, "-mq11.4", &flag))
            {
                options.use_half_float = flag;
            }
            else if(optflag(argv, "-mtyped-text-label", &flag))
            {
                options.has_text_label_prefix = flag;
            }
            else if(optflag(argv, "-moptimize-andor", &flag))
            {
                options.optimize_andor = flag;
            }
            else if(optflag(argv, "-moptimize-zero", &flag))
            {
                options.optimize_zero_floats = flag;
            }
            else if(optget(argv, nullptr, "-O", 0))
            {
                options.optimize_andor = true;
                options.optimize_zero_floats = true;
            }
            else if(optflag(argv, "-fentity-tracking", &flag))
            {
                options.entity_tracking = flag;
            }
            else if(optflag(argv, "-fscript-name-check", &flag))
            {
                options.script_name_check = flag;
            }
            else if(optflag(argv, "-frelax-not", &flag))
            {
                options.relax_not = flag;
            }
            else if(optflag(argv, "-fswitch", &flag))
            {
                options.fswitch = flag;
            }
            else if(optflag(argv, "-fbreak-continue", nullptr))
            {
                options.allow_break_continue = true;
            }
            else if(optflag(argv, "-fscope-then-label", &flag))
            {
                options.scope_then_label = flag;
            }
            else if(optflag(argv, "-funderscore-idents", &flag))
            {
                options.allow_underscore_identifiers = flag;
            }
            else if(optflag(argv, "-farrays", &flag))
            {
                options.farrays = flag;
            }
            else if(optflag(argv, "-fconst", &flag))
            {
                options.fconst = flag;
            }
            else if(optflag(argv, "-fstreamed-scripts", &flag))
            {
                options.streamed_scripts = flag;
            }
            else if(optflag(argv, "-ftext-label-vars", &flag))
            {
                options.text_label_vars = flag;
            }
            else if(optflag(argv, "-fskip-cutscene", &flag))
            {
                options.skip_cutscene = flag;
            }
            else if(optflag(argv, "-mlocal-offsets", nullptr))
            {
                options.use_local_offsets = true;
            }
            else if(optint(argv, "-ftimer-index", &options.timer_index)) {}
            else if(optint(argv, "-flocal-var-limit", &options.local_var_limit)) {}
            else if(optint(argv, "-fmission-var-limit", &temp_i32))
            {
                options.mission_var_limit = temp_i32 < 0? nullopt : optional<uint32_t>(temp_i32);
            }
            else if(optint(argv, "-fmission-var-begin", &temp_i32))
            {
                options.mission_var_begin = std::max(0, temp_i32);
            }
            else if(optint(argv, "-fswitch-case-limit", &temp_i32))
            {
                options.switch_case_limit = temp_i32 < 0? nullopt : optional<uint32_t>(temp_i32);
            }
            else if(optint(argv, "-farray-elem-limit", &temp_i32))
            {
                options.array_elem_limit = temp_i32 < 0? nullopt : optional<uint32_t>(temp_i32);
            }
            else if(optflag(argv, "-fsyntax-only", nullptr))
            {
                options.fsyntax_only = true;
            }
            else if(optflag(argv, "-emit-ir2", nullptr))
            {
                options.emit_ir2 = true;
            }
            else if(optflag(argv, "-fcleo", nullptr))
            {
                options.cleo.emplace(0);
            }
            else if(optget(argv, nullptr, "--cs", 0))
            {
                options.cleo.emplace(0);
                options.output_cleo = true;
                options.mission_script = false;
                options.headerless = true;
                options.use_local_offsets = true;
            }
            else if(optget(argv, nullptr, "--cm", 0))
            {
                options.cleo.emplace(0);
                options.output_cleo = true;
                options.mission_script = true;
                options.headerless = true;
                options.use_local_offsets = true;
            }
            else if(optflag(argv, "-fmission-script", nullptr))
            {
                options.mission_script = true;
            }
            else if(optflag(argv, "-Werror", &flag))
            {
                options.warning_is_error = flag;
            }
            else if(optflag(argv, "-Wconflict-text-label-var", &flag))
            {
                options.warn_conflict_text_label_var = flag;
            }
            else if(optflag(argv, "-Wexpect-var", &flag))
            {
                options.warn_expect_var = flag;
            }
            else if(optflag(argv, "-fconstant-checks", &flag))
            {
                options.constant_checks = flag;
            }
            else if(const char* name = optget(argv, "-D", "--define", 1))
            {
                options.define(name);
            }
            else if(const char* name = optget(argv, "-U", "--undefine", 1))
            {
                options.undefine(name);
            }
            else
            {
                fprintf(stderr, "gta3sc: error: unregonized argument '%s'\n", *argv);
                return false;
            }
        }

        return true;
    }
    catch(const invalid_opt& e)
    {
        fprintf(stderr, "gta3sc: error: %s\n", e.what());
        return false;
    }
}